

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::solvePhase2(HEkkPrimal *this)

{
  long lVar1;
  HighsCallback *pHVar2;
  bool bVar3;
  HighsDebugStatus HVar4;
  EVP_PKEY_CTX *pEVar5;
  HEkk *in_RDI;
  bool in_stack_0000003f;
  string *in_stack_00000040;
  HEkkPrimal *in_stack_00000048;
  bool in_stack_0000005f;
  HEkkPrimal *in_stack_00000060;
  bool finished;
  HighsModelStatus *model_status;
  HighsSimplexStatus *status;
  HighsOptions *options;
  undefined4 in_stack_ffffffffffffff80;
  HEkk *in_stack_ffffffffffffff88;
  allocator *paVar6;
  uint in_stack_ffffffffffffff94;
  uint uVar7;
  HEkk *in_stack_ffffffffffffffa0;
  HEkkPrimal *in_stack_ffffffffffffffb0;
  string local_48 [24];
  HEkkPrimal *in_stack_ffffffffffffffd0;
  HEkk *this_00;
  
  lVar1 = *(long *)((long)&(in_RDI->callback_->user_callback).super__Function_base._M_functor + 8);
  pHVar2 = in_RDI->callback_;
  this_00 = (HEkk *)&in_RDI->callback_[0x29].data_out.pdlp_iteration_count;
  pHVar2[0x25].data_out.field_0x4 = 0;
  *(undefined1 *)((long)&pHVar2[0x25].data_out.log_type + 3) = 0;
  bVar3 = HEkk::bailout(this_00);
  if (!bVar3) {
    highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kDetailed,"primal-phase2-start\n");
    phase2UpdatePrimal(in_stack_00000060,in_stack_0000005f);
    if (((ulong)in_RDI->callback_[0x27].user_callback._M_invoker & 0x100) == 0) {
      HEkk::putBacktrackingBasis(in_stack_ffffffffffffffa0);
    }
    do {
      rebuild(in_stack_ffffffffffffffb0);
      if (*(int *)((long)&(in_RDI->analysis_).timer_ + 4) == -3) {
        return;
      }
      if (*(int *)((long)&(in_RDI->analysis_).timer_ + 4) == -1) {
        return;
      }
      bVar3 = HEkk::bailout(this_00);
      if (bVar3) {
        return;
      }
      uVar7 = in_stack_ffffffffffffff94;
      if (*(int *)((long)&(in_RDI->analysis_).timer_ + 4) == 1) break;
      do {
        iterate(in_stack_ffffffffffffffd0);
        bVar3 = HEkk::bailout(this_00);
        if (bVar3) {
          return;
        }
        if (*(int *)((long)&(in_RDI->analysis_).timer_ + 4) == -3) {
          return;
        }
      } while (*(int *)&(in_RDI->analysis_).thread_factor_clocks.
                        super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                        _M_impl.super__Vector_impl_data._M_finish == 0);
      in_stack_ffffffffffffff94 = uVar7 & 0xffffff;
      if (((pHVar2[0x25].data_out.log_type & 0x10000) != 0) &&
         (in_stack_ffffffffffffff94 = uVar7 & 0xffffff, *(int *)&(in_RDI->analysis_).lp_name_ == 0))
      {
        bVar3 = HEkk::rebuildRefactor(in_RDI,in_stack_ffffffffffffff94);
        in_stack_ffffffffffffff94 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff94) ^ 0xff000000;
      }
      uVar7 = in_stack_ffffffffffffff94 & 0x1000000;
      if (((in_stack_ffffffffffffff94 & 0x1000000) != 0) &&
         (bVar3 = HEkk::tabooBadBasisChange(in_stack_ffffffffffffff88), bVar3)) {
        *(undefined4 *)((long)&(in_RDI->analysis_).timer_ + 4) = 5;
        return;
      }
    } while (uVar7 == 0);
    paVar6 = (allocator *)&stack0xffffffffffffffb7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"End of solvePhase2",paVar6);
    HVar4 = debugPrimalSimplex(in_stack_00000048,in_stack_00000040,in_stack_0000003f);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    if (HVar4 == kLogicalError) {
      *(undefined4 *)((long)&(in_RDI->analysis_).timer_ + 4) = 0xfffffffd;
    }
    else if (*(int *)((long)&(in_RDI->analysis_).timer_ + 4) == 1) {
      highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kDetailed,"primal-return-phase1\n");
    }
    else if (*(int *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 4) == -1) {
      pEVar5 = (EVP_PKEY_CTX *)0x2;
      highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kDetailed,"primal-phase-2-optimal\n");
      cleanup((HEkkPrimal *)in_RDI,pEVar5);
      if (*(int *)&in_RDI->callback_[0x28].data_out.cutpool_lower < 1) {
        *(undefined4 *)((long)&(in_RDI->analysis_).timer_ + 4) = 0;
        highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kDetailed,"problem-optimal\n");
        *(HighsInt *)&this_00->callback_ = 7;
        HEkk::computeDualObjectiveValue(in_stack_ffffffffffffffa0,(HighsInt)((ulong)in_RDI >> 0x20))
        ;
      }
      else {
        *(undefined4 *)((long)&(in_RDI->analysis_).timer_ + 4) = 4;
      }
    }
    else if (*(int *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == -2) {
      printf("HEkkPrimal::solvePhase2 row_out = %d solve %d\n",
             (ulong)*(uint *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                                     super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (ulong)*(uint *)&in_RDI->callback_[0x38].data_out.running_time);
      fflush(_stdout);
    }
    else {
      if (-1 < *(int *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                               super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) {
        printf("HEkkPrimal::solvePhase2 row_out = %d solve %d\n",
               (ulong)*(uint *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                                       super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
               (ulong)*(uint *)&in_RDI->callback_[0x38].data_out.running_time);
        fflush(_stdout);
      }
      pEVar5 = (EVP_PKEY_CTX *)0x1;
      highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kInfo,"primal-phase-2-unbounded\n");
      if (((ulong)in_RDI->callback_[0x28].data_out.cutpool_value & 0x1000000000000) == 0) {
        *(undefined4 *)((long)&(in_RDI->analysis_).timer_ + 4) = 0xfffffffe;
        savePrimalRay((HEkkPrimal *)CONCAT44(HVar4,in_stack_ffffffffffffff80));
        highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kInfo,"problem-primal-unbounded\n");
        *(HighsInt *)&this_00->callback_ = 10;
      }
      else {
        cleanup((HEkkPrimal *)in_RDI,pEVar5);
        if (0 < *(int *)&in_RDI->callback_[0x28].data_out.cutpool_lower) {
          *(undefined4 *)((long)&(in_RDI->analysis_).timer_ + 4) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::solvePhase2() {
  HighsOptions& options = *ekk_instance_.options_;
  HighsSimplexStatus& status = ekk_instance_.status_;
  HighsModelStatus& model_status = ekk_instance_.model_status_;
  // When starting a new phase the (updated) primal objective function
  // value isn't known. Indicate this so that when the value
  // computed from scratch in build() isn't checked against the
  // updated value
  status.has_primal_objective_value = false;
  status.has_dual_objective_value = false;
  // Possibly bail out immediately if iteration limit is current value
  if (ekk_instance_.bailout()) return;
  highsLogDev(options.log_options, HighsLogType::kDetailed,
              "primal-phase2-start\n");
  phase2UpdatePrimal(true);

  // If there's no backtracking basis Save the initial basis in case of
  // backtracking
  if (!ekk_instance_.info_.valid_backtracking_basis_)
    ekk_instance_.putBacktrackingBasis();

  // Main solving structure
  for (;;) {
    //
    // Rebuild
    //
    // solve_phase = kSolvePhaseError is set if the basis matrix is singular
    rebuild();
    if (solve_phase == kSolvePhaseError) return;
    if (solve_phase == kSolvePhaseUnknown) return;
    if (ekk_instance_.bailout()) return;
    assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2);
    //
    // solve_phase = kSolvePhase1 is set if primal infeasibilities
    // are found in rebuild(), in which case return for phase 1
    if (solve_phase == kSolvePhase1) break;

    for (;;) {
      iterate();
      if (ekk_instance_.bailout()) return;
      if (solve_phase == kSolvePhaseError) return;
      assert(solve_phase == kSolvePhase2);
      if (rebuild_reason) break;
    }
    // If the data are fresh from rebuild() and no flips have
    // occurred, possibly break out of the outer loop to see what's
    // occurred
    bool finished = status.has_fresh_rebuild && num_flip_since_rebuild == 0 &&
                    !ekk_instance_.rebuildRefactor(rebuild_reason);
    if (finished && ekk_instance_.tabooBadBasisChange()) {
      // A bad basis change has had to be made taboo without any other
      // basis changes or flips having been performed from a fresh
      // rebuild. In other words, the only basis change that could be
      // made is not permitted, so no definitive statement about the
      // LP can be made.
      solve_phase = kSolvePhaseTabooBasis;
      return;
    }
    if (finished) break;
  }
  // If bailing out, should have returned already
  assert(!ekk_instance_.solve_bailout_);
  if (debugPrimalSimplex("End of solvePhase2") ==
      HighsDebugStatus::kLogicalError) {
    solve_phase = kSolvePhaseError;
    return;
  }
  if (solve_phase == kSolvePhase1) {
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "primal-return-phase1\n");
  } else if (variable_in == -1) {
    // There is no candidate in CHUZC, even after rebuild so probably optimal
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "primal-phase-2-optimal\n");
    // Remove any bound perturbations and see if basis is still primal feasible
    cleanup();
    if (ekk_instance_.info_.num_primal_infeasibilities > 0) {
      // There are primal infeasibilities, so consider performing dual
      // simplex iterations to get primal feasibility
      solve_phase = kSolvePhaseOptimalCleanup;
    } else {
      // There are no primal infeasibilities so optimal!
      solve_phase = kSolvePhaseOptimal;
      highsLogDev(options.log_options, HighsLogType::kDetailed,
                  "problem-optimal\n");
      model_status = HighsModelStatus::kOptimal;
      ekk_instance_.computeDualObjectiveValue();  // Why?
    }
  } else if (row_out == kNoRowSought) {
    // CHUZR has not been performed - because the chosen reduced cost
    // was unattractive when computed from scratch and no rebuild was
    // required. This is very rare and should be handled otherwise
    //
    printf("HEkkPrimal::solvePhase2 row_out = %d solve %d\n", (int)row_out,
           (int)ekk_instance_.debug_solve_call_num_);
    fflush(stdout);
    assert(row_out != kNoRowSought);
  } else {
    // No candidate in CHUZR
    if (row_out >= 0) {
      printf("HEkkPrimal::solvePhase2 row_out = %d solve %d\n", (int)row_out,
             (int)ekk_instance_.debug_solve_call_num_);
      fflush(stdout);
    }
    // Ensure that CHUZR was performed and found no row
    assert(row_out == kNoRowChosen);

    // There is no candidate in CHUZR, so probably primal unbounded
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "primal-phase-2-unbounded\n");
    if (ekk_instance_.info_.bounds_perturbed) {
      // If the bounds have been perturbed, clean up and return
      cleanup();
      // If there are primal infeasibilities, go back to phase 1
      if (ekk_instance_.info_.num_primal_infeasibilities > 0)
        solve_phase = kSolvePhase1;
    } else {
      // The bounds have not been perturbed, so primal unbounded
      solve_phase = kSolvePhaseExit;
      // Primal unbounded, so save primal ray
      savePrimalRay();
      // Model status should be unset
      assert(model_status == HighsModelStatus::kNotset);
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "problem-primal-unbounded\n");
      model_status = HighsModelStatus::kUnbounded;
    }
  }
}